

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sDrawTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Stress::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  RenderContext *pRVar2;
  DrawTest *node;
  long *name;
  int iVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  deUint32 dVar8;
  deBool dVar9;
  int iVar10;
  _Rb_tree_color _Var11;
  _Rb_tree_color _Var12;
  CompatibilityTestType CVar13;
  int extraout_EAX;
  long lVar14;
  ulong uVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  deUint32 hash;
  DrawTestSpec spec;
  int attribCounts [3];
  DrawMethod drawMethods [2];
  IndexType indexTypes [3];
  int indirectOffsets [3];
  int firsts [3];
  int indexOffsets [3];
  int primitiveCounts [3];
  UniformWeightArray<3> indexTypeWeights;
  float indirectOffsetWeigths [3];
  float firstWeights [3];
  float indexOffsetWeights [3];
  float primitiveCountWeights [3];
  float attribWeights [3];
  int baseVertices [5];
  int instanceDivisors [4];
  int strides [4];
  int offsets [4];
  float indexWeights [4];
  int indexMaxs [4];
  int indexMins [4];
  int instanceCounts [4];
  float baseVertexWeigths [5];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  Primitive primitives [7];
  UniformWeightArray<7> primitiveWeights;
  Usage usages [9];
  float instanceDivisorWeights [4];
  float strideWeights [4];
  float offsetWeights [4];
  float instanceWeights [4];
  InputType inputTypes [11];
  UniformWeightArray<11> inputTypeWeights;
  OutputType outputTypes [12];
  UniformWeightArray<9> usageWeights;
  AttributeSpec attribSpec;
  Random random;
  UniformWeightArray<12> outputTypeWeights;
  _Rb_tree_color local_5ac;
  undefined1 local_5a8 [56];
  pointer local_570;
  iterator local_568;
  AttributeSpec *local_560;
  int local_558 [4];
  DrawTest *local_548;
  TestNode *local_540;
  long local_538;
  DrawMethod local_530 [2];
  long *local_528 [2];
  long local_518 [2];
  IndexType local_508 [4];
  int local_4f8 [4];
  int local_4e8 [4];
  int local_4d8 [4];
  int local_4c8 [4];
  RenderContext *local_4b8;
  TestContext *local_4b0;
  ulong local_4a8;
  float local_4a0 [4];
  float local_490 [6];
  float local_478 [4];
  float local_468 [4];
  float local_458 [4];
  float local_448 [4];
  int local_438 [8];
  int local_418 [12];
  float local_3e8 [4];
  int local_3d8 [12];
  float local_3a8 [8];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_388;
  Primitive local_358 [9];
  float local_334 [7];
  Usage local_318 [12];
  float local_2e8 [16];
  InputType local_2a8 [13];
  float local_274;
  InputType IStack_270;
  float afStack_26c [9];
  OutputType local_248 [14];
  float afStack_210 [10];
  AttributeSpec local_1e8 [2];
  ios_base local_178 [264];
  deRandom local_70;
  float local_60 [2];
  undefined8 auStack_58 [5];
  long lVar21;
  
  local_558[0] = 1;
  local_558[1] = 2;
  local_558[2] = 5;
  local_448[2] = 1.0;
  local_448[0] = 30.0;
  local_448[1] = 10.0;
  local_4c8[0] = 1;
  local_4c8[1] = 5;
  local_4c8[2] = 0x40;
  local_458[2] = 1.0;
  local_458[0] = 20.0;
  local_458[1] = 10.0;
  local_4d8[2] = 0xd;
  local_4d8[0] = 0;
  local_4d8[1] = 7;
  local_468[2] = 1.0;
  local_468[0] = 20.0;
  local_468[1] = 20.0;
  local_4e8[2] = 0xd;
  local_4e8[0] = 0;
  local_4e8[1] = 7;
  local_478[2] = 1.0;
  local_478[0] = 20.0;
  local_478[1] = 20.0;
  local_3d8[8] = 1;
  local_3d8[9] = 2;
  local_3d8[10] = 0x10;
  local_3d8[0xb] = 0x11;
  local_2e8[0xc] = 20.0;
  local_2e8[0xd] = 10.0;
  local_2e8[0xe] = 5.0;
  local_2e8[0xf] = 1.0;
  local_3d8[4] = 0;
  local_3d8[5] = 1;
  local_3d8[6] = 3;
  local_3d8[7] = 8;
  local_3d8[0] = 4;
  local_3d8[1] = 8;
  local_3d8[2] = 0x80;
  local_3d8[3] = 0x101;
  local_3e8[0] = 50.0;
  local_3e8[1] = 50.0;
  local_3e8[2] = 50.0;
  local_3e8[3] = 50.0;
  local_418[8] = 0;
  local_418[9] = 1;
  local_418[10] = 5;
  local_418[0xb] = 0xc;
  local_2e8[8] = 50.0;
  local_2e8[9] = 10.0;
  local_2e8[10] = 10.0;
  local_2e8[0xb] = 10.0;
  local_418[4] = 0;
  local_418[5] = 7;
  local_418[6] = 0x10;
  local_418[7] = 0x11;
  local_2e8[4] = 50.0;
  local_2e8[5] = 10.0;
  local_2e8[6] = 10.0;
  local_2e8[7] = 10.0;
  local_418[0] = 0;
  local_418[1] = 1;
  local_418[2] = 3;
  local_418[3] = 0x81;
  local_2e8[0] = 70.0;
  local_2e8[1] = 30.0;
  local_2e8[2] = 10.0;
  local_2e8[3] = 10.0;
  local_4f8[2] = 2;
  local_4f8[0] = 0;
  local_4f8[1] = 1;
  local_490[4] = 1.0;
  local_490[2] = 2.0;
  local_490[3] = 1.0;
  local_438[0] = 0;
  local_438[1] = 1;
  local_438[2] = -2;
  local_438[3] = 4;
  local_438[4] = 3;
  local_3a8[4] = 1.0;
  local_3a8[0] = 4.0;
  local_3a8[1] = 1.0;
  local_3a8[2] = 1.0;
  local_3a8[3] = 1.0;
  local_358[4] = 4;
  local_358[5] = PRIMITIVE_LINE_STRIP;
  local_358[6] = PRIMITIVE_LINE_LOOP;
  local_358[0] = PRIMITIVE_POINTS;
  local_358[1] = PRIMITIVE_TRIANGLES;
  local_358[2] = 2;
  local_358[3] = 3;
  local_334[0] = 1.0;
  local_334[1] = 1.0;
  local_334[2] = 1.0;
  local_334[3] = 1.0;
  local_334[4] = 1.0;
  local_334[5] = 1.0;
  local_334[6] = 1.0;
  local_530[0] = DRAWMETHOD_DRAWARRAYS_INDIRECT;
  local_530[1] = DRAWMETHOD_DRAWELEMENTS_INDIRECT;
  local_490[0] = 1.0;
  local_490[1] = 1.0;
  local_508[2] = 2;
  local_508[0] = INDEXTYPE_BYTE;
  local_508[1] = INDEXTYPE_SHORT;
  local_4a0[0] = 1.0;
  local_4a0[1] = 1.0;
  local_4a0[2] = 1.0;
  local_2a8[8] = 9;
  local_2a8[9] = INPUTTYPE_UNSIGNED_INT_2_10_10_10;
  local_2a8[10] = INPUTTYPE_INT_2_10_10_10;
  local_2a8[4] = INPUTTYPE_UNSIGNED_BYTE;
  local_2a8[5] = INPUTTYPE_UNSIGNED_SHORT;
  local_2a8[6] = 7;
  local_2a8[7] = 8;
  local_2a8[0] = INPUTTYPE_FLOAT;
  local_2a8[1] = INPUTTYPE_FIXED;
  local_2a8[2] = INPUTTYPE_BYTE;
  local_2a8[3] = INPUTTYPE_SHORT;
  lVar14 = 3;
  auVar22 = _DAT_01a25df0;
  auVar23 = _DAT_019fcc00;
  do {
    if (SUB164(auVar23 ^ _DAT_019f5ce0,4) == -0x80000000 &&
        SUB164(auVar23 ^ _DAT_019f5ce0,0) < -0x7ffffff5) {
      local_2a8[lVar14 + 10] = 0x3f800000;
      local_2a8[lVar14 + 0xb] = 0x3f800000;
    }
    if (SUB164(auVar22 ^ _DAT_019f5ce0,4) == -0x80000000 &&
        SUB164(auVar22 ^ _DAT_019f5ce0,0) < -0x7ffffff5) {
      (&local_274)[lVar14 + -1] = 1.0;
      (&local_274)[lVar14] = 1.0;
    }
    lVar21 = auVar23._8_8_;
    auVar23._0_8_ = auVar23._0_8_ + 4;
    auVar23._8_8_ = lVar21 + 4;
    lVar21 = auVar22._8_8_;
    auVar22._0_8_ = auVar22._0_8_ + 4;
    auVar22._8_8_ = lVar21 + 4;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0xf);
  local_248[8] = OUTPUTTYPE_IVEC4;
  local_248[9] = OUTPUTTYPE_UVEC2;
  local_248[10] = OUTPUTTYPE_UVEC3;
  local_248[0xb] = OUTPUTTYPE_UVEC4;
  local_248[4] = OUTPUTTYPE_INT;
  local_248[5] = OUTPUTTYPE_UINT;
  local_248[6] = OUTPUTTYPE_IVEC2;
  local_248[7] = OUTPUTTYPE_IVEC3;
  local_248[0] = OUTPUTTYPE_FLOAT;
  local_248[1] = OUTPUTTYPE_VEC2;
  local_248[2] = OUTPUTTYPE_VEC3;
  local_248[3] = OUTPUTTYPE_VEC4;
  lVar14 = 0;
  do {
    *(undefined8 *)((long)auStack_58 + lVar14 * 4 + -8) = 0x3f8000003f800000;
    *(undefined8 *)((long)auStack_58 + lVar14 * 4) = 0x3f8000003f800000;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0xc);
  local_318[4] = USAGE_STREAM_COPY;
  local_318[5] = USAGE_STATIC_READ;
  local_318[6] = USAGE_STATIC_COPY;
  local_318[7] = USAGE_DYNAMIC_READ;
  local_318[0] = USAGE_DYNAMIC_DRAW;
  local_318[1] = USAGE_STATIC_DRAW;
  local_318[2] = USAGE_STREAM_DRAW;
  local_318[3] = USAGE_STREAM_READ;
  local_318[8] = 8;
  lVar14 = 1;
  auVar20 = _DAT_019fcc00;
  do {
    if (SUB164(auVar20 ^ _DAT_019f5ce0,4) == -0x80000000 &&
        SUB164(auVar20 ^ _DAT_019f5ce0,0) < -0x7ffffff7) {
      afStack_210[lVar14] = 1.0;
      afStack_210[lVar14 + 1] = 1.0;
    }
    lVar21 = auVar20._8_8_;
    auVar20._0_8_ = auVar20._0_8_ + 2;
    auVar20._8_8_ = lVar21 + 2;
    lVar14 = lVar14 + 2;
  } while (lVar14 != 0xb);
  local_388._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_388._M_impl.super__Rb_tree_header._M_header;
  local_388._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar15 = 0;
  local_388._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_388._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_538 = 0;
  local_540 = (TestNode *)this;
  local_388._M_impl.super__Rb_tree_header._M_header._M_right =
       local_388._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    local_4a8 = uVar15;
    deRandom_init(&local_70,(int)uVar15 + 0xc551393);
    uVar7 = de::Random::chooseWeighted<int,int_const*,float_const*>
                      ((Random *)&local_70,local_558,local_558 + 3,local_448);
    deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_5a8);
    local_5a8._0_4_ = 0x13;
    local_5a8._4_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive*,float_const*>
                   ((Random *)&local_70,local_358,local_358 + 7,local_334);
    local_5a8._8_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_70,local_4c8,local_4c8 + 3,local_458);
    local_5a8._12_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod*,float_const*>
                   ((Random *)&local_70,local_530,(DrawMethod *)local_528,local_490);
    if (local_5a8._12_4_ == DRAWMETHOD_DRAWARRAYS_INDIRECT) {
      iVar19 = 0x10;
LAB_016ab29d:
      local_5a8._16_4_ =
           de::Random::
           chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType*,float_const*>
                     ((Random *)&local_70,local_508,local_508 + 3,local_4a0);
      local_5a8._20_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_70,local_4d8,local_4d8 + 3,local_468);
      local_5a8._24_4_ = STORAGE_BUFFER;
      local_5a8._28_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_70,local_4e8,local_4e8 + 3,local_478);
      local_5a8._32_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_70,local_3d8 + 4,local_3d8 + 8,local_3e8);
      local_5a8._36_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_70,local_3d8,local_3d8 + 4,local_3e8);
      local_5a8._40_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_70,local_3d8 + 8,(int *)local_3a8,local_2e8 + 0xc);
      local_5a8._44_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_70,local_4f8,local_4f8 + 3,local_490 + 2);
      local_5a8._44_4_ = local_5a8._44_4_ * iVar19;
      local_5a8._48_4_ =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)&local_70,local_438,local_438 + 5,local_3a8);
      bVar5 = deqp::gls::DrawTestSpec::valid((DrawTestSpec *)local_5a8);
      bVar6 = false;
      if (bVar5) {
        if (0 < (int)uVar7) {
          iVar19 = 0;
          do {
            deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec(local_1e8);
            local_1e8[0].inputType =
                 de::Random::
                 chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType*,float_const*>
                           ((Random *)&local_70,local_2a8,local_2a8 + 0xb,&local_274);
            local_1e8[0].outputType =
                 de::Random::
                 chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType*,float_const*>
                           ((Random *)&local_70,local_248,local_248 + 0xc,local_60);
            local_1e8[0].storage = STORAGE_BUFFER;
            local_1e8[0].usage =
                 de::Random::
                 chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage*,float_const*>
                           ((Random *)&local_70,local_318,local_318 + 9,afStack_210 + 1);
            dVar8 = deRandom_getUint32(&local_70);
            local_1e8[0].componentCount = (dVar8 & 3) + 1;
            local_1e8[0].offset =
                 de::Random::chooseWeighted<int,int_const*,float_const*>
                           ((Random *)&local_70,local_418 + 8,(int *)local_3e8,local_2e8 + 8);
            local_1e8[0].stride =
                 de::Random::chooseWeighted<int,int_const*,float_const*>
                           ((Random *)&local_70,local_418 + 4,local_418 + 8,local_2e8 + 4);
            dVar9 = deRandom_getBool(&local_70);
            local_1e8[0].normalize = dVar9 == 1;
            local_1e8[0].instanceDivisor =
                 de::Random::chooseWeighted<int,int_const*,float_const*>
                           ((Random *)&local_70,local_418,local_418 + 4,local_2e8);
            dVar9 = deRandom_getBool(&local_70);
            local_1e8[0].useDefaultAttribute = dVar9 == 1;
            bVar6 = deqp::gls::DrawTestSpec::AttributeSpec::valid
                              (local_1e8,(ApiType)local_5a8._0_4_);
            iVar3 = local_1e8[0].componentCount;
            if (local_1e8[0].stride == 0) {
              if (bVar6) goto LAB_016ab56c;
            }
            else {
              iVar10 = deqp::gls::DrawTestSpec::inputTypeSize(local_1e8[0].inputType);
              if (bVar6 && iVar10 * iVar3 <= local_1e8[0].stride) {
LAB_016ab56c:
                if (local_568._M_current == local_560) {
                  std::
                  vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                  ::_M_realloc_insert<deqp::gls::DrawTestSpec::AttributeSpec_const&>
                            ((vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                              *)&local_570,local_568,local_1e8);
                }
                else {
                  (local_568._M_current)->instanceDivisor = local_1e8[0].instanceDivisor;
                  (local_568._M_current)->useDefaultAttribute = (bool)(char)local_1e8[0]._36_4_;
                  (local_568._M_current)->additionalPositionAttribute =
                       (bool)SUB41(local_1e8[0]._36_4_,1);
                  (local_568._M_current)->bgraComponentOrder = (bool)SUB41(local_1e8[0]._36_4_,2);
                  (local_568._M_current)->field_0x27 = SUB41(local_1e8[0]._36_4_,3);
                  (local_568._M_current)->componentCount = local_1e8[0].componentCount;
                  (local_568._M_current)->offset = local_1e8[0].offset;
                  (local_568._M_current)->stride = local_1e8[0].stride;
                  (local_568._M_current)->normalize = (bool)(char)local_1e8[0]._28_4_;
                  *(int3 *)&(local_568._M_current)->field_0x1d = SUB43(local_1e8[0]._28_4_,1);
                  (local_568._M_current)->inputType = local_1e8[0].inputType;
                  (local_568._M_current)->outputType = local_1e8[0].outputType;
                  (local_568._M_current)->storage = local_1e8[0].storage;
                  (local_568._M_current)->usage = local_1e8[0].usage;
                  local_568._M_current = local_568._M_current + 1;
                }
                iVar19 = iVar19 + 1;
              }
            }
          } while (iVar19 < (int)uVar7);
        }
        if (local_5a8._4_4_ != PRIMITIVE_POINTS) {
          local_570->instanceDivisor = 0;
        }
        if (((((local_5a8._12_4_ == DRAWMETHOD_DRAWELEMENTS_RANGED) &&
              (local_5a8._4_4_ != PRIMITIVE_POINTS)) && (local_5a8._32_4_ == local_5a8._36_4_)) ||
            ((local_5a8._4_4_ != PRIMITIVE_POINTS && (local_570->useDefaultAttribute != false)))) ||
           ((local_5a8._4_4_ - PRIMITIVE_TRIANGLES < 3 &&
            (((local_570->componentCount == 1 ||
              ((local_570->outputType < OUTPUTTYPE_IVEC2 &&
               ((0x31U >> (local_570->outputType & 0x1f) & 1) != 0)))) ||
             ((local_5a8._12_4_ == DRAWMETHOD_DRAWELEMENTS_RANGED &&
              ((int)(local_5a8._36_4_ - local_5a8._32_4_) < 2)))))))) {
          bVar6 = false;
        }
        else {
          _Var11 = deqp::gls::DrawTestSpec::hash((DrawTestSpec *)local_5a8);
          if (0 < (int)uVar7) {
            lVar14 = 0;
            do {
              local_5ac = _Var11;
              _Var12 = deqp::gls::DrawTestSpec::AttributeSpec::hash
                                 ((AttributeSpec *)((long)&local_570->inputType + lVar14));
              _Var11 = _Var11 << 2 ^ _Var12;
              lVar14 = lVar14 + 0x28;
            } while ((ulong)uVar7 * 0x28 != lVar14);
          }
          local_5ac = _Var11;
          if (local_388._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_016ab6dd:
            CVar13 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_5a8);
            if ((CVar13 == COMPATIBILITY_UNALIGNED_OFFSET) ||
               (CVar13 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_5a8),
               CVar13 == COMPATIBILITY_UNALIGNED_STRIDE)) {
              local_548 = (DrawTest *)operator_new(0x138);
              pTVar1 = local_540->m_testCtx;
              pRVar2 = ((Context *)local_540[1]._vptr_TestNode)->m_renderCtx;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              local_4b8 = pRVar2;
              local_4b0 = pTVar1;
              std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
              std::ios_base::~ios_base(local_178);
              name = local_528[0];
              deqp::gls::DrawTestSpec::getDesc_abi_cxx11_
                        ((string *)local_1e8,(DrawTestSpec *)local_5a8);
              node = local_548;
              deqp::gls::DrawTest::DrawTest
                        (local_548,local_4b0,local_4b8,(DrawTestSpec *)local_5a8,(char *)name,
                         (char *)CONCAT44(local_1e8[0].outputType,local_1e8[0].inputType));
              tcu::TestNode::addChild(local_540,(TestNode *)node);
              if ((int *)CONCAT44(local_1e8[0].outputType,local_1e8[0].inputType) !=
                  &local_1e8[0].componentCount) {
                operator_delete((undefined1 *)
                                CONCAT44(local_1e8[0].outputType,local_1e8[0].inputType),
                                CONCAT44(local_1e8[0].offset,local_1e8[0].componentCount) + 1);
              }
              if (local_528[0] != local_518) {
                operator_delete(local_528[0],local_518[0] + 1);
              }
            }
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&local_388,&local_5ac);
            local_538 = local_538 + 1;
          }
          else {
            p_Var4 = local_388._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var18 = &local_388._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var17 = p_Var18;
              p_Var16 = p_Var4;
              _Var12 = p_Var16[1]._M_color;
              p_Var18 = p_Var16;
              if (_Var12 < _Var11) {
                p_Var18 = p_Var17;
              }
              p_Var4 = (&p_Var16->_M_left)[_Var12 < _Var11];
            } while ((&p_Var16->_M_left)[_Var12 < _Var11] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var18 == &local_388._M_impl.super__Rb_tree_header)
            goto LAB_016ab6dd;
            if (_Var12 < _Var11) {
              p_Var16 = p_Var17;
            }
            if (_Var11 < p_Var16[1]._M_color) goto LAB_016ab6dd;
          }
          bVar6 = false;
        }
      }
    }
    else {
      bVar6 = true;
      if (local_5a8._12_4_ == DRAWMETHOD_DRAWELEMENTS_INDIRECT) {
        iVar19 = 0x14;
        goto LAB_016ab29d;
      }
    }
    if (local_570 != (pointer)0x0) {
      operator_delete(local_570,(long)local_560 - (long)local_570);
    }
    if ((bVar6) || (uVar7 = (int)local_4a8 + 1, uVar15 = (ulong)uVar7, uVar7 == 100)) {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_388);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void RandomGroup::init (void)
{
	const int	numAttempts				= 100;

	const int	attribCounts[]			= { 1,   2,   5 };
	const float	attribWeights[]			= { 30, 10,   1 };
	const int	primitiveCounts[]		= { 1,   5,  64 };
	const float	primitiveCountWeights[]	= { 20, 10,   1 };
	const int	indexOffsets[]			= { 0,   7,  13 };
	const float	indexOffsetWeights[]	= { 20, 20,   1 };
	const int	firsts[]				= { 0,   7,  13 };
	const float	firstWeights[]			= { 20, 20,   1 };

	const int	instanceCounts[]		= { 1,   2,  16,  17 };
	const float	instanceWeights[]		= { 20, 10,   5,   1 };
	const int	indexMins[]				= { 0,   1,   3,   8 };
	const int	indexMaxs[]				= { 4,   8, 128, 257 };
	const float	indexWeights[]			= { 50, 50,  50,  50 };
	const int	offsets[]				= { 0,   1,   5,  12 };
	const float	offsetWeights[]			= { 50, 10,  10,  10 };
	const int	strides[]				= { 0,   7,  16,  17 };
	const float	strideWeights[]			= { 50, 10,  10,  10 };
	const int	instanceDivisors[]		= { 0,   1,   3, 129 };
	const float	instanceDivisorWeights[]= { 70, 30,  10,  10 };

	const int	indirectOffsets[]		= { 0,   1,   2 };
	const float indirectOffsetWeigths[]	= { 2,   1,   1 };
	const int	baseVertices[]			= { 0,   1,  -2,   4,  3 };
	const float baseVertexWeigths[]		= { 4,   1,   1,   1,  1 };

	gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
		gls::DrawTestSpec::INDEXTYPE_INT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT,
		gls::DrawTestSpec::INPUTTYPE_INT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT,
		gls::DrawTestSpec::INPUTTYPE_HALF,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		gls::DrawTestSpec::INPUTTYPE_INT_2_10_10_10,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
		gls::DrawTestSpec::OUTPUTTYPE_INT,
		gls::DrawTestSpec::OUTPUTTYPE_UINT,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC4,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_READ,
		gls::DrawTestSpec::USAGE_STREAM_COPY,
		gls::DrawTestSpec::USAGE_STATIC_READ,
		gls::DrawTestSpec::USAGE_STATIC_COPY,
		gls::DrawTestSpec::USAGE_DYNAMIC_READ,
		gls::DrawTestSpec::USAGE_DYNAMIC_COPY,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		int					drawCommandSize;
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(3,1);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);

		if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT)
			drawCommandSize = sizeof(deUint32[4]);
		else if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT)
			drawCommandSize = sizeof(deUint32[5]);
		else
		{
			DE_ASSERT(DE_FALSE);
			return;
		}

		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMins),			DE_ARRAY_END(indexMins),		indexWeights);
		spec.indexMax				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMaxs),			DE_ARRAY_END(indexMaxs),		indexWeights);
		spec.instanceCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(instanceCounts),	DE_ARRAY_END(instanceCounts),	instanceWeights);
		spec.indirectOffset			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indirectOffsets),	DE_ARRAY_END(indirectOffsets),	indirectOffsetWeigths) * drawCommandSize;
		spec.baseVertex				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(baseVertices),		DE_ARRAY_END(baseVertices),		baseVertexWeigths);

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= gls::DrawTestSpec::STORAGE_BUFFER;
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(instanceDivisors), DE_ARRAY_END(instanceDivisors), instanceDivisorWeights);
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end())
			{
				// Only unaligned cases
				if (spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET ||
					spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}